

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
(anonymous_namespace)::KeyParser::
FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (KeyParser *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ParseScriptContext PVar4;
  pointer *__ptr;
  long in_FS_OFFSET;
  CPubKey pubkey_1;
  XOnlyPubKey pubkey;
  __uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  local_a8;
  CPubKey local_99;
  XOnlyPubKey local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 8) == 0) {
    __assert_fail("m_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6b2,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  lVar1 = *(long *)(this + 0x10);
  lVar2 = *(long *)(this + 0x18);
  if (*(int *)(this + 0x48) == 0) {
    CPubKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_99,begin,end);
    PVar4 = P2WSH;
    if (*(int *)(this + 0x48) != 0) {
      if (*(int *)(this + 0x48) != 1) {
LAB_00dc3aac:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                      ,0x69e,
                      "ParseScriptContext (anonymous namespace)::KeyParser::ParseContext() const");
      }
      PVar4 = P2TR;
    }
    anon_unknown.dwarf_5733c63::InferPubkey
              ((anon_unknown_dwarf_5733c63 *)&local_58,&local_99,PVar4,
               *(SigningProvider **)(this + 8));
    if ((PubkeyProvider *)local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ !=
        (PubkeyProvider *)0x0) {
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::emplace_back<>((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                        *)(this + 0x10));
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)(*(long *)(this + 0x18) + -0x18),
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&local_58);
      local_a8._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
      .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            )(tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              )local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
LAB_00dc3a1f:
      if ((_Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>)
          local_a8._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
          (_Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>)0x0) {
        (*((PubkeyProvider *)
          local_a8._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)->
          _vptr_PubkeyProvider[1])();
      }
      uVar3 = 0x100000000;
      goto LAB_00dc3a38;
    }
  }
  else {
    if (*(int *)(this + 0x48) != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    if ((long)end._M_current - (long)begin._M_current == 0x20) {
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = (PubkeyProvider *)0x0;
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_58.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      if (end._M_current != begin._M_current) {
        local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)begin._M_current;
        local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)(begin._M_current + 8);
        local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)(begin._M_current + 0x10);
        local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)(begin._M_current + 0x18);
      }
      XOnlyPubKey::GetEvenCorrespondingCPubKey(&local_99,&local_58);
      PVar4 = P2WSH;
      if (*(int *)(this + 0x48) != 0) {
        if (*(int *)(this + 0x48) != 1) goto LAB_00dc3aac;
        PVar4 = P2TR;
      }
      anon_unknown.dwarf_5733c63::InferPubkey
                ((anon_unknown_dwarf_5733c63 *)&local_a8,&local_99,PVar4,
                 *(SigningProvider **)(this + 8));
      if (local_a8._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           )0x0) {
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::emplace_back<>((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                          *)(this + 0x10));
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    *)(*(long *)(this + 0x18) + -0x18),
                   (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_a8);
        goto LAB_00dc3a1f;
      }
    }
  }
  uVar3 = 0;
LAB_00dc3a38:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (optional<unsigned_int>)
           (uVar3 | (uint)((int)((ulong)(lVar2 - lVar1) >> 3) * -0x55555555));
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKBytes(I begin, I end) const
    {
        assert(m_in);
        Key key = m_keys.size();
        if (miniscript::IsTapscript(m_script_ctx) && end - begin == 32) {
            XOnlyPubKey pubkey;
            std::copy(begin, end, pubkey.begin());
            if (auto pubkey_provider = InferPubkey(pubkey.GetEvenCorrespondingCPubKey(), ParseContext(), *m_in)) {
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        } else if (!miniscript::IsTapscript(m_script_ctx)) {
            CPubKey pubkey(begin, end);
            if (auto pubkey_provider = InferPubkey(pubkey, ParseContext(), *m_in)) {
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        }
        return {};
    }